

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O3

bool __thiscall
slang::ast::ValueExpressionBase::requireLValueImpl
          (ValueExpressionBase *this,ASTContext *context,SourceLocation location,
          bitmask<slang::ast::AssignFlags> flags,Expression *longestStaticPrefix)

{
  Compilation *this_00;
  SourceRange varRange;
  bool bVar1;
  uint uVar2;
  Diagnostic *pDVar4;
  Type *this_01;
  Type *pTVar5;
  Symbol *args_2;
  ValueDriver *driver;
  SourceLocation SVar6;
  DiagCode code;
  ValueSymbol *context_00;
  SourceRange sourceRange;
  undefined1 in_stack_ffffffffffffffb8 [14];
  DriverKind in_stack_ffffffffffffffc6;
  bitmask<slang::ast::AssignFlags> bVar8;
  int iVar3;
  SourceLocation SVar7;
  
  SVar7 = (this->super_Expression).sourceRange.startLoc;
  if (((ulong)location & 0xfffffff) == 0) {
    location = SVar7;
  }
  context_00 = this->symbol;
  iVar3 = (context_00->super_Symbol).kind;
  if ((iVar3 - 0xbU < 0x40) && ((0x8000000010000001U >> ((ulong)(iVar3 - 0xbU) & 0x3f) & 1) != 0)) {
    pDVar4 = ASTContext::addDiag(context,(DiagCode)0x380007,location);
    pDVar4 = Diagnostic::operator<<(pDVar4,(this->symbol->super_Symbol).name);
    Diagnostic::addNote(pDVar4,(DiagCode)0x50001,(this->symbol->super_Symbol).location);
    Diagnostic::operator<<(pDVar4,(this->super_Expression).sourceRange);
    return false;
  }
  bVar8.m_bits = flags.m_bits;
  if (((context->flags).m_bits & 0x20) == 0) {
    if (iVar3 == 0x3b) {
      SVar6 = (this->super_Expression).sourceRange.endLoc;
      code.subsystem = Expressions;
      code.code = 10;
LAB_004a17ea:
      sourceRange.endLoc = SVar6;
      sourceRange.startLoc = SVar7;
      ASTContext::addDiag(context,code,sourceRange);
      return false;
    }
  }
  else {
    this_01 = DeclaredType::getType(&context_00->declaredType);
    pTVar5 = this_01->canonical;
    if (pTVar5 == (Type *)0x0) {
      Type::resolveCanonical(this_01);
      pTVar5 = this_01->canonical;
    }
    if ((pTVar5->super_Symbol).kind == CHandleType) {
      SVar7 = (this->super_Expression).sourceRange.startLoc;
      SVar6 = (this->super_Expression).sourceRange.endLoc;
      code.subsystem = Expressions;
      code.code = 9;
      goto LAB_004a17ea;
    }
    context_00 = this->symbol;
    iVar3 = (context_00->super_Symbol).kind;
    if (iVar3 == 0x3b) {
      if ((flags.m_bits & 0x10) != 0 &&
          *(int *)&(*(Scope **)&context_00[1].super_Symbol)[2].nameMap == 0xc) {
        pDVar4 = ASTContext::addDiag(context,(DiagCode)0x590007,(this->super_Expression).sourceRange
                                    );
        Diagnostic::operator<<(pDVar4,(this->symbol->super_Symbol).name);
        return false;
      }
      goto LAB_004a187d;
    }
  }
  uVar2 = iVar3 - 0x2d;
  if (uVar2 < 0x28) {
    if ((0xc006078000U >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
      if ((ulong)uVar2 == 0) {
        if (context_00[1].super_Symbol.kind == 0) {
          pDVar4 = ASTContext::addDiag(context,(DiagCode)0x5d0007,
                                       (this->super_Expression).sourceRange);
          Diagnostic::operator<<(pDVar4,(this->symbol->super_Symbol).name);
          Diagnostic::addNote(pDVar4,(DiagCode)0x50001,(this->symbol->super_Symbol).location);
          return false;
        }
        SVar7 = context_00[1].super_Symbol.location;
        if (SVar7 != (SourceLocation)0x0) {
          if ((((((context->flags).m_bits & 0x100000000) == 0) &&
               (bVar1 = Scope::isUninstantiated((context->scope).ptr),
               longestStaticPrefix == (Expression *)0x0)) && (!bVar1)) &&
             ((this->super_Expression).kind == HierarchicalValue)) {
            bVar1 = HierarchicalReference::isViaIfacePort((HierarchicalReference *)(this + 1));
            if (bVar1) {
              this_00 = ((context->scope).ptr)->compilation;
              ASTContext::getDriverKind(context);
              args_2 = ASTContext::getContainingSymbol(context);
              driver = BumpAllocator::
                       emplace<slang::ast::ValueDriver,slang::ast::DriverKind,slang::ast::ValueExpressionBase_const&,slang::ast::Symbol_const&,slang::bitmask<slang::ast::AssignFlags>&>
                                 (&this_00->super_BumpAllocator,&stack0xffffffffffffffc6,this,args_2
                                  ,(bitmask<slang::ast::AssignFlags> *)&stack0xffffffffffffffc7);
              flags.m_bits = bVar8.m_bits;
              Compilation::noteInterfacePortDriver
                        (this_00,(HierarchicalReference *)(this + 1),driver);
            }
          }
          bVar1 = Expression::requireLValue
                            ((Expression *)SVar7,context,location,flags,longestStaticPrefix);
          return bVar1;
        }
      }
    }
    else {
      varRange.endLoc._6_1_ = in_stack_ffffffffffffffc6;
      varRange._0_14_ = in_stack_ffffffffffffffb8;
      varRange.endLoc._7_1_ = bVar8.m_bits;
      bVar1 = checkVariableAssignment
                        ((ValueExpressionBase *)context,(ASTContext *)context_00,
                         (VariableSymbol *)(ulong)flags.m_bits,
                         (bitmask<slang::ast::AssignFlags>)location._0_1_,
                         (this->super_Expression).sourceRange.startLoc,varRange);
      if (!bVar1) {
        return false;
      }
    }
  }
LAB_004a187d:
  if ((((this->super_Expression).kind == HierarchicalValue) &&
      (((context->flags).m_bits & 0x100000000) == 0)) &&
     (bVar1 = Scope::isUninstantiated((context->scope).ptr), !bVar1)) {
    bVar1 = HierarchicalReference::isViaIfacePort((HierarchicalReference *)(this + 1));
    if (!bVar1) {
      Compilation::noteHierarchicalAssignment
                (((context->scope).ptr)->compilation,(HierarchicalReference *)(this + 1));
    }
  }
  if (longestStaticPrefix == (Expression *)0x0) {
    longestStaticPrefix = &this->super_Expression;
  }
  ASTContext::addDriver(context,this->symbol,longestStaticPrefix,flags);
  return true;
}

Assistant:

bool ValueExpressionBase::requireLValueImpl(const ASTContext& context, SourceLocation location,
                                            bitmask<AssignFlags> flags,
                                            const Expression* longestStaticPrefix) const {
    if (!location)
        location = sourceRange.start();

    if (symbol.kind == SymbolKind::Parameter || symbol.kind == SymbolKind::EnumValue ||
        symbol.kind == SymbolKind::Specparam) {
        auto& diag = context.addDiag(diag::CantModifyConst, location) << symbol.name;
        diag.addNote(diag::NoteDeclarationHere, symbol.location);
        diag << sourceRange;
        return false;
    }

    if (context.flags.has(ASTFlags::NonProcedural)) {
        // chandles can only be assigned in procedural contexts.
        if (symbol.getType().isCHandle()) {
            context.addDiag(diag::AssignToCHandle, sourceRange);
            return false;
        }

        if (symbol.kind == SymbolKind::Net &&
            symbol.as<NetSymbol>().netType.netKind == NetType::UWire &&
            flags.has(AssignFlags::InOutPort)) {
            context.addDiag(diag::InOutUWireConn, sourceRange) << symbol.name;
            return false;
        }
    }
    else {
        // Nets can't be assigned in procedural contexts.
        if (symbol.kind == SymbolKind::Net) {
            context.addDiag(diag::AssignToNet, sourceRange);
            return false;
        }
    }

    if (VariableSymbol::isKind(symbol.kind)) {
        if (!checkVariableAssignment(context, symbol.as<VariableSymbol>(), flags, location,
                                     sourceRange)) {
            return false;
        }
    }
    else if (symbol.kind == SymbolKind::ModportPort) {
        auto& modportPort = symbol.as<ModportPortSymbol>();
        if (modportPort.direction == ArgumentDirection::In) {
            auto& diag = context.addDiag(diag::InputPortAssign, sourceRange);
            diag << symbol.name;
            diag.addNote(diag::NoteDeclarationHere, symbol.location);
            return false;
        }

        if (auto expr = modportPort.getConnectionExpr()) {
            // We want to record this redirection with the compilation as a side
            // effect of the instance port used to get here. Normally that gets
            // done in the ValueSymbol::addDriver call but because we redirect
            // here we'll lose that information so need to do it manually.
            if (!context.flags.has(ASTFlags::NotADriver) && !context.scope->isUninstantiated() &&
                kind == ExpressionKind::HierarchicalValue && !longestStaticPrefix) {

                auto& hve = as<HierarchicalValueExpression>();
                if (hve.ref.isViaIfacePort()) {
                    auto& comp = context.getCompilation();
                    auto driver = comp.emplace<ValueDriver>(context.getDriverKind(), *this,
                                                            context.getContainingSymbol(), flags);
                    comp.noteInterfacePortDriver(hve.ref, *driver);
                }
            }

            // The assignment is actually to the underlying connection expression,
            // so redirect it there.
            return expr->requireLValue(context, location, flags, longestStaticPrefix);
        }
    }

    if (kind == ExpressionKind::HierarchicalValue && !context.flags.has(ASTFlags::NotADriver) &&
        !context.scope->isUninstantiated()) {
        auto& ref = as<HierarchicalValueExpression>().ref;
        if (!ref.isViaIfacePort())
            context.getCompilation().noteHierarchicalAssignment(ref);
    }

    if (!longestStaticPrefix)
        longestStaticPrefix = this;
    context.addDriver(symbol, *longestStaticPrefix, flags);

    return true;
}